

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::ObjectType::operator<(ObjectType *this,ObjectType *Value)

{
  KUINT32 ui32OtherCmpVal;
  KUINT32 ui32ThisCmpVal;
  ObjectType *Value_local;
  ObjectType *this_local;
  
  return ((uint)this->m_ui8SubCategory << 0x18 | (uint)this->m_ui8EntityKind << 0x10 |
          (uint)this->m_ui8Category << 8 | (uint)this->m_ui8SubCategory) <
         ((uint)Value->m_ui8SubCategory << 0x18 | (uint)Value->m_ui8EntityKind << 0x10 |
          (uint)Value->m_ui8Category << 8 | (uint)Value->m_ui8SubCategory);
}

Assistant:

KBOOL ObjectType::operator < ( const ObjectType & Value ) const
{
    // We will bit shift all 4 fields into a single KUINT32, this will generate a new unique value which we can then use for comparisons.
    // bits 24-31 = SubCategory
    // bits 16-23 = Category
    // bits 8-15  = Kind
    // bits 0-7   = Domain

    KUINT32 ui32ThisCmpVal = 0, ui32OtherCmpVal = 0;

    ui32ThisCmpVal = ( KUINT32 )m_ui8SubCategory << 24 | ( KUINT32 )m_ui8EntityKind << 16 | ( KUINT32 )m_ui8Category << 8 | ( KUINT32 )m_ui8SubCategory;
    ui32OtherCmpVal = ( KUINT32 )Value.m_ui8SubCategory << 24 | ( KUINT32 )Value.m_ui8EntityKind << 16 | ( KUINT32 )Value.m_ui8Category << 8 | ( KUINT32 )Value.m_ui8SubCategory;

    return ui32ThisCmpVal < ui32OtherCmpVal;
}